

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void prvTidyParseEmpty(TidyDocImpl *doc,Node *element,GetTokenMode mode)

{
  Node *node;
  
  if (doc->lexer->isvoyager != no) {
    node = prvTidyGetToken(doc,mode);
    if (node != (Node *)0x0) {
      if ((node->type == EndTag) && (node->tag == element->tag)) {
        prvTidyFreeNode(doc,node);
        return;
      }
      prvTidyUngetToken(doc);
      return;
    }
  }
  return;
}

Assistant:

void TY_(ParseEmpty)(TidyDocImpl* doc, Node *element, GetTokenMode mode)
{
    Lexer* lexer = doc->lexer;
    if ( lexer->isvoyager )
    {
        Node *node = TY_(GetToken)( doc, mode);
        if ( node )
        {
            if ( !(node->type == EndTag && node->tag == element->tag) )
            {
                /* TY_(Report)(doc, element, node, ELEMENT_NOT_EMPTY); */
                TY_(UngetToken)( doc );
            }
            else
            {
                TY_(FreeNode)( doc, node );
            }
        }
    }
}